

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void argo::operator<<(string *s,json *j)

{
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  unparser::unparse(local_188,j," ",""," ",0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)s,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void NAMESPACE::operator<<(string &s, const json &j)
{
    stringstream ss;
    unparser::unparse(ss, j);
    s = ss.str();
}